

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O2

int blake2sp_update(blake2sp_state *S,void *pin,size_t inlen)

{
  ulong uVar1;
  void *pin_00;
  long lVar2;
  uint8_t *pin_01;
  void *local_48;
  size_t local_40;
  
  local_40 = S->buflen;
  local_48 = pin;
  if (local_40 == 0) {
    local_40 = 0;
  }
  else {
    uVar1 = 0x200 - local_40;
    if (uVar1 <= inlen) {
      pin_01 = S->buf;
      memcpy(S->buf + local_40,pin,uVar1);
      for (lVar2 = 0; lVar2 != 0x440; lVar2 = lVar2 + 0x88) {
        blake2s_update((blake2s_state *)((long)S->S[0][0].h + lVar2),pin_01,0x40);
        pin_01 = pin_01 + 0x40;
      }
      local_48 = (void *)((long)pin + uVar1);
      local_40 = 0;
      inlen = inlen - uVar1;
    }
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    pin_00 = (void *)(lVar2 * 0x40 + (long)local_48);
    for (uVar1 = inlen; 0x1ff < uVar1; uVar1 = uVar1 - 0x200) {
      blake2s_update(S->S[lVar2],pin_00,0x40);
      pin_00 = (void *)((long)pin_00 + 0x200);
    }
  }
  uVar1 = inlen & 0x1ff;
  if (uVar1 != 0) {
    memcpy(S->buf + local_40,(void *)((long)local_48 + (inlen & 0xfffffffffffffe00)),uVar1);
  }
  S->buflen = uVar1 + local_40;
  return 0;
}

Assistant:

int blake2sp_update( blake2sp_state *S, const void *pin, size_t inlen )
{
  const unsigned char * in = (const unsigned char *)pin;
  size_t left = S->buflen;
  size_t fill = sizeof( S->buf ) - left;
  size_t i;

  if( left && inlen >= fill )
  {
    memcpy( S->buf + left, in, fill );

    for( i = 0; i < PARALLELISM_DEGREE; ++i )
      blake2s_update( S->S[i], S->buf + i * BLAKE2S_BLOCKBYTES, BLAKE2S_BLOCKBYTES );

    in += fill;
    inlen -= fill;
    left = 0;
  }

#if defined(_OPENMP)
  #pragma omp parallel shared(S), num_threads(PARALLELISM_DEGREE)
#else
  for( i = 0; i < PARALLELISM_DEGREE; ++i )
#endif
  {
#if defined(_OPENMP)
    size_t      i = omp_get_thread_num();
#endif
    size_t inlen__ = inlen;
    const unsigned char *in__ = ( const unsigned char * )in;
    in__ += i * BLAKE2S_BLOCKBYTES;

    while( inlen__ >= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES )
    {
      blake2s_update( S->S[i], in__, BLAKE2S_BLOCKBYTES );
      in__ += PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
      inlen__ -= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
    }
  }

  in += inlen - inlen % ( PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES );
  inlen %= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;

  if( inlen > 0 )
    memcpy( S->buf + left, in, inlen );

  S->buflen = left + inlen;
  return 0;
}